

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByLowercaseName(Descriptor *this,string *key)

{
  second_type pFVar1;
  FieldDescriptor *pFVar2;
  
  pFVar1 = FindPtrOrNull<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                     (*(hash_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                        **)(*(long *)(*(long *)(this + 0x10) + 0xa8) + 0x38),
                      *(first_type **)(*(long *)(*(long *)(this + 0x10) + 0xa8) + 0x40));
  if (pFVar1 == (second_type)0x0) {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar2 = (FieldDescriptor *)0x0;
    if (pFVar1[0x50] != (FieldDescriptor)0x0) {
      pFVar2 = pFVar1;
    }
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor*
Descriptor::FindExtensionByLowercaseName(const string& key) const {
  const FieldDescriptor* result =
    file()->tables_->FindFieldByLowercaseName(this, key);
  if (result == NULL || !result->is_extension()) {
    return NULL;
  } else {
    return result;
  }
}